

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotificationDispatcher.cpp
# Opt level: O0

void __thiscall NotificationDispatcher::Run(NotificationDispatcher *this)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  unsigned_long timestamp_00;
  element_type *peVar6;
  ostream *poVar7;
  int local_204;
  string local_200 [32];
  stringstream local_1e0 [8];
  stringstream stream;
  ostream local_1d0 [392];
  undefined1 local_48 [8];
  shared_ptr<Notification> notification;
  uint size;
  uint hNotify;
  uint32_t sample;
  uint numSamples;
  unsigned_long timestamp;
  uint32_t stamp;
  uint numStamps;
  uint length;
  uint fullLength;
  NotificationDispatcher *this_local;
  
  do {
    Semaphore::acquire(&this->sem);
    bVar2 = std::atomic::operator_cast_to_bool((atomic *)&this->stopExecution);
    if (bVar2) {
      return;
    }
    uVar3 = RingBuffer::ReadFromLittleEndian<unsigned_int>(&this->ring);
    RingBuffer::ReadFromLittleEndian<unsigned_int>(&this->ring);
    uVar4 = RingBuffer::ReadFromLittleEndian<unsigned_int>(&this->ring);
    numStamps = uVar3 - 8;
    for (timestamp._0_4_ = 0; (uint)timestamp < uVar4; timestamp._0_4_ = (uint)timestamp + 1) {
      timestamp_00 = RingBuffer::ReadFromLittleEndian<unsigned_long>(&this->ring);
      uVar3 = RingBuffer::ReadFromLittleEndian<unsigned_int>(&this->ring);
      numStamps = numStamps - 0xc;
      for (size = 0; size < uVar3; size = size + 1) {
        notification.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = RingBuffer::ReadFromLittleEndian<unsigned_int>(&this->ring);
        notification.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = RingBuffer::ReadFromLittleEndian<unsigned_int>(&this->ring);
        numStamps = numStamps - 8;
        Find((NotificationDispatcher *)local_48,(uint32_t)this);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
        uVar1 = (uint)notification.super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        if (bVar2) {
          peVar6 = std::__shared_ptr_access<Notification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Notification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48);
          uVar5 = Notification::Size(peVar6);
          if (uVar1 == uVar5) {
            peVar6 = std::
                     __shared_ptr_access<Notification,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Notification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48);
            Notification::Notify(peVar6,timestamp_00,&this->ring);
            goto LAB_001a5df4;
          }
          std::__cxx11::stringstream::stringstream(local_1e0);
          poVar7 = std::operator<<(local_1d0,"Notification sample size: ");
          poVar7 = (ostream *)
                   std::ostream::operator<<
                             (poVar7,(uint)notification.
                                           super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
          poVar7 = std::operator<<(poVar7," doesn\'t match: ");
          peVar6 = std::__shared_ptr_access<Notification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Notification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48);
          uVar5 = Notification::Size(peVar6);
          std::ostream::operator<<(poVar7,uVar5);
          std::__cxx11::stringstream::str();
          Logger::Log(2,local_200);
          std::__cxx11::string::~string((string *)local_200);
          std::__cxx11::stringstream::~stringstream(local_1e0);
          local_204 = 0xc;
        }
        else {
          RingBuffer::Read(&this->ring,
                           (ulong)(uint)notification.
                                        super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
LAB_001a5df4:
          numStamps = numStamps -
                      (uint)notification.
                            super___shared_ptr<Notification,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            ._M_pi;
          local_204 = 0;
        }
        std::shared_ptr<Notification>::~shared_ptr((shared_ptr<Notification> *)local_48);
        if (local_204 != 0) goto LAB_001a5e4d;
      }
    }
LAB_001a5e4d:
    RingBuffer::Read(&this->ring,(ulong)numStamps);
  } while( true );
}

Assistant:

void NotificationDispatcher::Run()
{
    for ( ; ; ) {
        sem.acquire();
        if (stopExecution) {
            return;
        }
        auto fullLength = ring.ReadFromLittleEndian<uint32_t>();
        const auto length = ring.ReadFromLittleEndian<uint32_t>();
        (void)length;
        const auto numStamps = ring.ReadFromLittleEndian<uint32_t>();
        fullLength -= sizeof(length) + sizeof(numStamps);
        for (uint32_t stamp = 0; stamp < numStamps; ++stamp) {
            const auto timestamp = ring.ReadFromLittleEndian<uint64_t>();
            const auto numSamples = ring.ReadFromLittleEndian<uint32_t>();
            fullLength -= sizeof(timestamp) + sizeof(numSamples);
            for (uint32_t sample = 0; sample < numSamples; ++sample) {
                const auto hNotify = ring.ReadFromLittleEndian<uint32_t>();
                const auto size = ring.ReadFromLittleEndian<uint32_t>();
                fullLength -= sizeof(hNotify) + sizeof(size);
                const auto notification = Find(hNotify);
                if (notification) {
                    if (size != notification->Size()) {
                        LOG_WARN("Notification sample size: " << size << " doesn't match: " << notification->Size());
                        goto cleanup;
                    }
                    notification->Notify(timestamp, ring);
                } else {
                    ring.Read(size);
                }
                fullLength -= size;
            }
        }
cleanup:
        ring.Read(fullLength);
    }
}